

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_sim.c
# Opt level: O2

int idaNlsConvTestSensSim
              (SUNNonlinearSolver NLS,N_Vector ycor,N_Vector del,sunrealtype tol,N_Vector ewt,
              void *ida_mem)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int m;
  sunrealtype local_20;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x1ae,"idaNlsConvTestSensSim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls_sim.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    local_20 = tol;
    dVar2 = (double)N_VWrmsNorm(del,ewt);
    iVar1 = SUNNonlinSolGetCurIter(NLS,&m);
    if (iVar1 == 0) {
      if (m == 0) {
        *(double *)((long)ida_mem + 0x530) = dVar2;
        if (dVar2 <= *(double *)((long)ida_mem + 0x548) * 0.0001) {
          return 0;
        }
        dVar3 = *(double *)((long)ida_mem + 0x528);
      }
      else {
        dVar3 = (double)SUNRpowerR(dVar2 / *(double *)((long)ida_mem + 0x530),1.0 / (double)m);
        if (0.9 < dVar3) {
          return 0x386;
        }
        dVar3 = dVar3 / (1.0 - dVar3);
        *(double *)((long)ida_mem + 0x528) = dVar3;
      }
      iVar1 = 0x385;
      if (dVar2 * dVar3 <= local_20) {
        iVar1 = 0;
      }
    }
    else {
      iVar1 = -0x14;
    }
  }
  return iVar1;
}

Assistant:

static int idaNlsConvTestSensSim(SUNNonlinearSolver NLS,
                                 SUNDIALS_MAYBE_UNUSED N_Vector ycor,
                                 N_Vector del, sunrealtype tol, N_Vector ewt,
                                 void* ida_mem)
{
  IDAMem IDA_mem;
  int m, retval;
  sunrealtype delnrm;
  sunrealtype rate;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* compute the norm of the correction */
  delnrm = N_VWrmsNorm(del, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != IDA_SUCCESS) { return (IDA_MEM_NULL); }

  /* test for convergence, first directly, then with rate estimate. */
  if (m == 0)
  {
    IDA_mem->ida_oldnrm = delnrm;
    if (delnrm <= PT0001 * IDA_mem->ida_toldel) { return (SUN_SUCCESS); }
  }
  else
  {
    rate = SUNRpowerR(delnrm / IDA_mem->ida_oldnrm, ONE / m);
    if (rate > RATEMAX) { return (SUN_NLS_CONV_RECVR); }
    IDA_mem->ida_ss = rate / (ONE - rate);
  }

  if (IDA_mem->ida_ss * delnrm <= tol) { return (SUN_SUCCESS); }

  /* not yet converged */
  return (SUN_NLS_CONTINUE);
}